

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O2

string * __thiscall
Chart::renderWeekday_abi_cxx11_
          (string *__return_storage_ptr__,Chart *this,Datetime *day,Color *color)

{
  uint uVar1;
  ostream *poVar2;
  int dow;
  string local_1e0;
  string local_1c0;
  stringstream out;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  uVar1 = Datetime::dayOfWeek(day);
  Datetime::dayNameShort_abi_cxx11_(&local_1e0,(Datetime *)(ulong)uVar1,dow);
  Color::colorize(&local_1c0,color,&local_1e0);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  std::operator<<(poVar2,' ');
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string Chart::renderWeekday (Datetime& day, const Color& color)
{
  std::stringstream out;

  out << color.colorize (Datetime::dayNameShort (day.dayOfWeek ()))
      << ' ';

  return out.str ();
}